

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

void seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  uint uVar2;
  TString *pTVar3;
  TValue *io;
  
  if (errcode == 6) {
    pTVar3 = luaS_newlstr(L,"error in error handling",0x17);
  }
  else {
    if (errcode != 4) {
      pTVar1 = L->top;
      oldtop->value_ = pTVar1[-1].value_;
      uVar2 = pTVar1[-1].tt_;
      goto LAB_001082c1;
    }
    pTVar3 = L->l_G->memerrmsg;
  }
  (oldtop->value_).f = (lua_CFunction)pTVar3;
  uVar2 = (pTVar3->tsv).tt | 0x40;
LAB_001082c1:
  oldtop->tt_ = uVar2;
  L->top = oldtop + 1;
  return;
}

Assistant:

static void seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    default: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}